

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall wabt::interp::Thread::DoMemoryFill(Thread *this,Instr instr,Ptr *out_trap)

{
  Store *pSVar1;
  bool bVar2;
  RefVec *this_00;
  const_reference pvVar3;
  Memory *this_01;
  allocator local_99;
  string local_98;
  Ptr local_78;
  Enum local_5c;
  u64 local_58;
  u64 dst;
  u64 uStack_48;
  uint value;
  u64 size;
  undefined1 local_38 [8];
  Ptr memory;
  Ptr *out_trap_local;
  Thread *this_local;
  
  pSVar1 = this->store_;
  memory.root_index_ = (Index)out_trap;
  this_00 = Instance::memories(this->inst_);
  pvVar3 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                     (this_00,(ulong)instr.field_2.imm_u32);
  size = pvVar3->index;
  RefPtr<wabt::interp::Memory>::RefPtr((RefPtr<wabt::interp::Memory> *)local_38,pSVar1,(Ref)size);
  uStack_48 = PopPtr(this,(Ptr *)local_38);
  dst._4_4_ = Pop<unsigned_int>(this);
  local_58 = PopPtr(this,(Ptr *)local_38);
  this_01 = RefPtr<wabt::interp::Memory>::operator->((RefPtr<wabt::interp::Memory> *)local_38);
  local_5c = (Enum)Memory::Fill(this_01,local_58,(u8)dst._4_4_,uStack_48);
  bVar2 = Failed((Result)local_5c);
  if (bVar2) {
    pSVar1 = this->store_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_98,"out of bounds memory access: memory.fill out of bounds",
               &local_99);
    Trap::New(&local_78,pSVar1,&local_98,&this->frames_);
    RefPtr<wabt::interp::Trap>::operator=
              ((RefPtr<wabt::interp::Trap> *)memory.root_index_,&local_78);
    this_local._4_4_ = Trap;
    RefPtr<wabt::interp::Trap>::~RefPtr(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
  }
  else {
    this_local._4_4_ = Ok;
  }
  RefPtr<wabt::interp::Memory>::~RefPtr((RefPtr<wabt::interp::Memory> *)local_38);
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoMemoryFill(Instr instr, Trap::Ptr* out_trap) {
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32]};
  auto size = PopPtr(memory);
  auto value = Pop<u32>();
  auto dst = PopPtr(memory);
  TRAP_IF(Failed(memory->Fill(dst, value, size)),
          "out of bounds memory access: memory.fill out of bounds");
  return RunResult::Ok;
}